

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EmitLoadFormalIntoRegister
          (ByteCodeGenerator *this,ParseNode *pnodeFormal,RegSlot pos,FuncInfo *funcInfo)

{
  Symbol *this_00;
  bool bVar1;
  RegSlot RVar2;
  ParseNodeVar *pPVar3;
  Symbol *formal;
  FuncInfo *funcInfo_local;
  RegSlot pos_local;
  ParseNode *pnodeFormal_local;
  ByteCodeGenerator *this_local;
  
  bVar1 = ParseNode::IsVarLetOrConst(pnodeFormal);
  if (bVar1) {
    pPVar3 = ParseNode::AsParseNodeVar(pnodeFormal);
    this_00 = pPVar3->sym;
    RVar2 = Symbol::GetLocation(this_00);
    if (RVar2 + 1 == pos) {
      RVar2 = Symbol::GetLocation(this_00);
      EmitLocalPropInit(this,RVar2,this_00,funcInfo);
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitLoadFormalIntoRegister(ParseNode *pnodeFormal, Js::RegSlot pos, FuncInfo *funcInfo)
{
    if (pnodeFormal->IsVarLetOrConst())
    {
        // Get the param from its argument position into its assigned register.
        // The position should match the location, otherwise, it has been shadowed by parameter with the same name
        Symbol *formal = pnodeFormal->AsParseNodeVar()->sym;
        if (formal->GetLocation() + 1 == pos)
        {
            // Transfer to the frame object, etc., if necessary.
            this->EmitLocalPropInit(formal->GetLocation(), formal, funcInfo);
        }
    }
}